

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserSamTest_FormatError_Test::~BioparserSamTest_FormatError_Test
          (BioparserSamTest_FormatError_Test *this)

{
  BioparserSamTest::~BioparserSamTest(&this->super_BioparserSamTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserSamTest, FormatError) {
  Setup("sample.paf");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::SamParser] error: invalid file format");
  }
}